

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symtable.cpp
# Opt level: O0

SymTable *
SymTable::from_script(SymTable *__return_storage_ptr__,Script *script,ProgramContext *program)

{
  ProgramContext *program_local;
  Script *script_local;
  SymTable *symbols;
  
  SymTable(__return_storage_ptr__);
  scan_symbols(__return_storage_ptr__,script,program);
  return __return_storage_ptr__;
}

Assistant:

auto SymTable::from_script(Script& script, ProgramContext& program) -> SymTable
{
    SymTable symbols;
    symbols.scan_symbols(script, program);
    return symbols;
}